

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void GCTM(lua_State *L)

{
  undefined1 uVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  Value *pVVar5;
  long lVar6;
  long in_RDI;
  TValue *i_o;
  TValue *o1;
  TValue *o2;
  lu_mem oldt;
  lu_byte oldah;
  TValue *tm;
  Udata *udata;
  GCObject *o;
  global_State *g;
  TString *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  Table *in_stack_ffffffffffffffa8;
  lua_State *plVar7;
  
  lVar2 = *(long *)(in_RDI + 0x20);
  puVar3 = (undefined8 *)**(long **)(lVar2 + 0x50);
  if (puVar3 == *(undefined8 **)(lVar2 + 0x50)) {
    *(undefined8 *)(lVar2 + 0x50) = 0;
  }
  else {
    **(undefined8 **)(lVar2 + 0x50) = *puVar3;
  }
  *puVar3 = **(undefined8 **)(lVar2 + 0xb0);
  **(long **)(lVar2 + 0xb0) = (long)puVar3;
  *(byte *)((long)puVar3 + 9) = *(byte *)((long)puVar3 + 9) & 0xf8 | *(byte *)(lVar2 + 0x20) & 3;
  if (puVar3[2] == 0) {
    plVar7 = (lua_State *)0x0;
  }
  else if ((*(byte *)(puVar3[2] + 10) & 4) == 0) {
    in_stack_ffffffffffffffa0 =
         (lua_State *)
         luaT_gettm(in_stack_ffffffffffffffa8,(TMS)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                    in_stack_ffffffffffffff98);
    plVar7 = in_stack_ffffffffffffffa0;
  }
  else {
    in_stack_ffffffffffffffa0 = (lua_State *)0x0;
    plVar7 = in_stack_ffffffffffffffa0;
  }
  if (plVar7 != (lua_State *)0x0) {
    uVar1 = *(undefined1 *)(in_RDI + 0x65);
    uVar4 = *(undefined8 *)(lVar2 + 0x70);
    *(undefined1 *)(in_RDI + 0x65) = 0;
    *(long *)(lVar2 + 0x70) = *(long *)(lVar2 + 0x78) << 1;
    pVVar5 = *(Value **)(in_RDI + 0x10);
    *pVVar5 = *(Value *)&plVar7->next;
    pVVar5[1].b = *(int *)&plVar7->tt;
    lVar6 = *(long *)(in_RDI + 0x10);
    *(undefined8 **)(lVar6 + 0x10) = puVar3;
    *(undefined4 *)(lVar6 + 0x18) = 7;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 0x20;
    luaD_call(in_stack_ffffffffffffffa0,(StkId)&in_stack_ffffffffffffff98->tsv,0);
    *(undefined1 *)(in_RDI + 0x65) = uVar1;
    *(undefined8 *)(lVar2 + 0x70) = uVar4;
  }
  return;
}

Assistant:

static void GCTM(lua_State*L){
global_State*g=G(L);
GCObject*o=g->tmudata->gch.next;
Udata*udata=rawgco2u(o);
const TValue*tm;
if(o==g->tmudata)
g->tmudata=NULL;
else
g->tmudata->gch.next=udata->uv.next;
udata->uv.next=g->mainthread->next;
g->mainthread->next=o;
makewhite(g,o);
tm=fasttm(L,udata->uv.metatable,TM_GC);
if(tm!=NULL){
lu_byte oldah=L->allowhook;
lu_mem oldt=g->GCthreshold;
L->allowhook=0;
g->GCthreshold=2*g->totalbytes;
setobj(L,L->top,tm);
setuvalue(L,L->top+1,udata);
L->top+=2;
luaD_call(L,L->top-2,0);
L->allowhook=oldah;
g->GCthreshold=oldt;
}
}